

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

QList<QtGraphicsAnchorLayout::AnchorData_*> * getVariables(QList<QSimplexConstraint_*> *constraints)

{
  long lVar1;
  bool bVar2;
  const_iterator *this;
  qsizetype qVar3;
  QSimplexVariable **ppQVar4;
  QList<QSimplexConstraint_*> *in_RSI;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *in_RDI;
  long in_FS_OFFSET;
  QSimplexConstraint *c;
  int i;
  const_iterator end;
  const_iterator it;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> variableSet;
  qsizetype in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  QSimplexVariable *in_stack_ffffffffffffff78;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *this_00;
  int local_5c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x93ea2f);
  local_5c = 0;
  while( true ) {
    this = (const_iterator *)(long)local_5c;
    qVar3 = QList<QSimplexConstraint_*>::size(in_RSI);
    if (qVar3 <= (long)this) break;
    QList<QSimplexConstraint_*>::at
              ((QList<QSimplexConstraint_*> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QHash<QSimplexVariable_*,_double>::cbegin((QHash<QSimplexVariable_*,_double> *)this_00);
    QHash<QSimplexVariable_*,_double>::cend
              ((QHash<QSimplexVariable_*,_double> *)in_stack_ffffffffffffff78);
    while( true ) {
      bVar2 = QHash<QSimplexVariable_*,_double>::const_iterator::operator!=
                        ((const_iterator *)in_stack_ffffffffffffff78,
                         (const_iterator *)in_stack_ffffffffffffff70);
      if (!bVar2) break;
      ppQVar4 = QHash<QSimplexVariable_*,_double>::const_iterator::key((const_iterator *)0x93eaf0);
      in_stack_ffffffffffffff78 = *ppQVar4;
      if (in_stack_ffffffffffffff78 == (QSimplexVariable *)0x0) {
        in_stack_ffffffffffffff70 = (int *)0x0;
      }
      else {
        in_stack_ffffffffffffff70 = &in_stack_ffffffffffffff78[-1].index;
      }
      QSet<QtGraphicsAnchorLayout::AnchorData_*>::insert
                ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)this_00,(AnchorData **)this);
      QHash<QSimplexVariable_*,_double>::const_iterator::operator++(this);
    }
    local_5c = local_5c + 1;
  }
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::values
            ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)this);
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::~QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x93eb75);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<AnchorData *> getVariables(const QList<QSimplexConstraint *> &constraints)
{
    QSet<AnchorData *> variableSet;
    for (int i = 0; i < constraints.size(); ++i) {
        const QSimplexConstraint *c = constraints.at(i);
        for (auto it = c->variables.cbegin(), end = c->variables.cend(); it != end; ++it)
            variableSet.insert(static_cast<AnchorData *>(it.key()));
    }
    return variableSet.values();
}